

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_number.hpp
# Opt level: O3

type_conflict2
jsoncons::detail::from_integer<unsigned_long,std::__cxx11::string>
          (unsigned_long value,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *result)

{
  bool bVar1;
  assertion_error *this;
  ulong uVar2;
  ulong uVar3;
  byte *pbVar4;
  char_type buf [255];
  string local_148;
  byte local_128 [264];
  
  uVar3 = 0;
  do {
    uVar2 = uVar3;
    local_128[uVar2] = (char)value + (char)(value / 10) * -10 | 0x30;
    uVar3 = uVar2 + 1;
    if (0xfd < uVar2) break;
    bVar1 = 9 < value;
    value = value / 10;
  } while (bVar1);
  if (uVar3 != 0xff) {
    pbVar4 = local_128 + uVar2;
    do {
      std::__cxx11::string::push_back((char)result);
      pbVar4 = pbVar4 + -1;
    } while (local_128 <= pbVar4);
    return uVar3;
  }
  this = (assertion_error *)__cxa_allocate_exception(0x10);
  local_148._M_dataplus._M_p = (pointer)&local_148.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_148,"assertion \'p != last\' failed at  <> :0","");
  assertion_error::assertion_error(this,&local_148);
  __cxa_throw(this,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

typename std::enable_if<ext_traits::is_integer<Integer>::value,std::size_t>::type
    from_integer(Integer value, Result& result)
    {
        using char_type = typename Result::value_type;

        char_type buf[255];
        char_type *p = buf;
        const char_type* last = buf+255;

        bool is_negative = value < 0;

        if (value < 0)
        {
            do
            {
                *p++ = static_cast<char_type>(48 - (value % 10));
            }
            while ((value /= 10) && (p < last));
        }
        else
        {

            do
            {
                *p++ = static_cast<char_type>(48 + value % 10);
            }
            while ((value /= 10) && (p < last));
        }
        JSONCONS_ASSERT(p != last);

        std::size_t count = (p - buf);
        if (is_negative)
        {
            result.push_back('-');
            ++count;
        }
        while (--p >= buf)
        {
            result.push_back(*p);
        }

        return count;
    }